

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

ly_set * lys_xpath_atomize(lys_node *ctx_node,lyxp_node_type ctx_node_type,char *expr,int options)

{
  int iVar1;
  lys_module *module;
  bool bVar2;
  uint local_84;
  uint32_t i;
  ly_set *ret_set;
  lyxp_set set;
  uint local_2c;
  int options_local;
  char *expr_local;
  lys_node *plStack_18;
  lyxp_node_type ctx_node_type_local;
  lys_node *ctx_node_local;
  
  if ((ctx_node == (lys_node *)0x0) || (expr == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_xpath_atomize");
    ctx_node_local = (lys_node *)0x0;
  }
  else {
    plStack_18 = ctx_node;
    if ((ctx_node_type == LYXP_NODE_ROOT) || (ctx_node_type == LYXP_NODE_ROOT_CONFIG)) {
      do {
        module = lys_node_module(plStack_18);
        plStack_18 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0x100);
        bVar2 = false;
        if (ctx_node_type == LYXP_NODE_ROOT_CONFIG) {
          bVar2 = (plStack_18->flags & 2) != 0;
        }
      } while (bVar2);
    }
    memset(&ret_set,0,0x40);
    if ((options & 1U) == 0) {
      if ((options & 2U) == 0) {
        local_2c = options | 4;
      }
      else {
        local_2c = options & 0xfffffffdU | 0x10;
      }
    }
    else {
      local_2c = options & 0xfffffffeU | 8;
    }
    iVar1 = lyxp_atomize(expr,plStack_18,ctx_node_type,(lyxp_set *)&ret_set,local_2c,
                         (lys_node **)0x0);
    if (iVar1 == 0) {
      ctx_node_local = (lys_node *)ly_set_new();
      for (local_84 = 0; local_84 < (uint)set.val._8_4_; local_84 = local_84 + 1) {
        if ((*(int *)(set._8_8_ + 8 + (ulong)local_84 * 0x10) == 2) &&
           (iVar1 = ly_set_add((ly_set *)ctx_node_local,
                               *(void **)(set._8_8_ + (ulong)local_84 * 0x10),1), iVar1 == -1)) {
          ly_set_free((ly_set *)ctx_node_local);
          free((void *)set._8_8_);
          return (ly_set *)0x0;
        }
      }
      free((void *)set._8_8_);
    }
    else {
      free((void *)set._8_8_);
      ly_vlog(plStack_18->module->ctx,LYE_SPEC,LY_VLOG_LYS,plStack_18,
              "Resolving XPath expression \"%s\" failed.",expr);
      ctx_node_local = (lys_node *)0x0;
    }
  }
  return (ly_set *)ctx_node_local;
}

Assistant:

ly_set *
lys_xpath_atomize(const struct lys_node *ctx_node, enum lyxp_node_type ctx_node_type, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;

    if (!ctx_node || !expr) {
        LOGARG;
        return NULL;
    }

    /* adjust the root */
    if ((ctx_node_type == LYXP_NODE_ROOT) || (ctx_node_type == LYXP_NODE_ROOT_CONFIG)) {
        do {
            ctx_node = lys_getnext(NULL, NULL, lys_node_module(ctx_node), LYS_GETNEXT_NOSTATECHECK);
        } while ((ctx_node_type == LYXP_NODE_ROOT_CONFIG) && (ctx_node->flags & LYS_CONFIG_R));
    }

    memset(&set, 0, sizeof set);

    if (options & LYXP_MUST) {
        options &= ~LYXP_MUST;
        options |= LYXP_SNODE_MUST;
    } else if (options & LYXP_WHEN) {
        options &= ~LYXP_WHEN;
        options |= LYXP_SNODE_WHEN;
    } else {
        options |= LYXP_SNODE;
    }

    if (lyxp_atomize(expr, ctx_node, ctx_node_type, &set, options, NULL)) {
        free(set.val.snodes);
        LOGVAL(ctx_node->module->ctx, LYE_SPEC, LY_VLOG_LYS, ctx_node, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}